

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCanBeNull(Expr *p)

{
  Column *pCVar1;
  byte bVar2;
  int iVar3;
  
  while (bVar2 = p->op, bVar2 - 0xad < 2) {
    p = p->pLeft;
  }
  if (bVar2 == 0xb0) {
    bVar2 = p->op2;
  }
  if ((bVar2 - 0x99 < 3) || (bVar2 == 0x75)) {
    return 0;
  }
  if (bVar2 == 0xa7) {
    iVar3 = 1;
    if (((p->flags & 0x200000) == 0) && ((p->y).pTab != (Table *)0x0)) {
      if ((long)p->iColumn < 0) {
        return 0;
      }
      pCVar1 = ((p->y).pTab)->aCol;
      iVar3 = 0;
      if (pCVar1 != (Column *)0x0) {
        return (int)((pCVar1[p->iColumn].field_0x8 & 0xf) == 0);
      }
    }
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCanBeNull(const Expr *p){
  u8 op;
  assert( p!=0 );
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){
    p = p->pLeft;
    assert( p!=0 );
  }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER:
    case TK_STRING:
    case TK_FLOAT:
    case TK_BLOB:
      return 0;
    case TK_COLUMN:
      assert( ExprUseYTab(p) );
      return ExprHasProperty(p, EP_CanBeNull) ||
             p->y.pTab==0 ||  /* Reference to column of index on expression */
             (p->iColumn>=0
              && p->y.pTab->aCol!=0 /* Possible due to prior error */
              && p->y.pTab->aCol[p->iColumn].notNull==0);
    default:
      return 1;
  }
}